

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O0

void dmrC_convert_instruction_target(dmr_C *C,instruction *insn,pseudo_t src)

{
  pseudo_t ppVar1;
  int iVar2;
  undefined1 local_48 [8];
  ptr_list_iter puiter__;
  pseudo_user *pu;
  pseudo_t target;
  pseudo_t src_local;
  instruction *insn_local;
  dmr_C *C_local;
  
  ppVar1 = (insn->field_5).target;
  if (ppVar1 != src) {
    ptrlist_forward_iterator((ptr_list_iter *)local_48,(ptr_list *)ppVar1->users);
    puiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_48);
    while (puiter__._16_8_ != 0) {
      if ((pseudo *)**(long **)(puiter__._16_8_ + 8) != &C->L->void_pseudo) {
        if ((pseudo_t)**(long **)(puiter__._16_8_ + 8) != ppVar1) {
          __assert_fail("*pu->userp == target",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                        ,0x9d9,
                        "void dmrC_convert_instruction_target(struct dmr_C *, struct instruction *, pseudo_t)"
                       );
        }
        **(undefined8 **)(puiter__._16_8_ + 8) = src;
      }
      puiter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)local_48);
    }
    iVar2 = dmrC_has_use_list(src);
    if (iVar2 != 0) {
      concat_user_list(ppVar1->users,&src->users);
    }
    ppVar1->users = (pseudo_user_list *)0x0;
  }
  return;
}

Assistant:

void dmrC_convert_instruction_target(struct dmr_C *C, struct instruction *insn, pseudo_t src)
{
	pseudo_t target;
	struct pseudo_user *pu;
	/*
	 * Go through the "insn->users" list and replace them all..
	 */
	target = insn->target;
	if (target == src)
		return;
	FOR_EACH_PTR(target->users, pu) {
		if (*pu->userp != VOID_PSEUDO(C)) {
			assert(*pu->userp == target);
			*pu->userp = src;
		}
	} END_FOR_EACH_PTR(pu);
	if (dmrC_has_use_list(src))
		concat_user_list(target->users, &src->users);
	target->users = NULL;
}